

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Vec_Bit_t * Gia_ManFindComplLuts(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  byte bVar4;
  Vec_Bit_t *pVVar5;
  int *__s;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  
  iVar10 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  pVVar5 = (Vec_Bit_t *)malloc(0x10);
  pVVar5->nSize = 0;
  iVar7 = iVar10 * 0x20;
  pVVar5->nCap = iVar7;
  if (iVar10 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar10 * 4);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar7;
  memset(__s,0,(long)iVar10 << 2);
  pVVar2 = pGia->vCos;
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      iVar10 = piVar3[lVar8];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) goto LAB_00742b96;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGia->pObjs + iVar10;
      uVar9 = (uint)*(undefined8 *)pGVar1;
      uVar6 = *(uint *)(pGVar1 + -(ulong)(uVar9 & 0x1fffffff));
      if (((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) && ((uVar9 >> 0x1d & 1) != 0)) {
        if (pGia->nObjs <= iVar10) goto LAB_00742bb5;
        uVar6 = iVar10 - (uVar9 & 0x1fffffff);
        if (((int)uVar6 < 0) || (iVar7 <= (int)uVar6)) goto LAB_00742bd4;
        __s[uVar6 >> 5] = __s[uVar6 >> 5] | 1 << ((byte)uVar6 & 0x1f);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  if (0 < pVVar2->nSize) {
    piVar3 = pVVar2->pArray;
    lVar8 = 0;
    do {
      iVar10 = piVar3[lVar8];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) {
LAB_00742b96:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar5;
      }
      pGVar1 = pGia->pObjs + iVar10;
      uVar9 = (uint)*(undefined8 *)pGVar1;
      uVar6 = *(uint *)(pGVar1 + -(ulong)(uVar9 & 0x1fffffff));
      if (((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) && ((uVar9 >> 0x1d & 1) == 0)) {
        if (pGia->nObjs <= iVar10) {
LAB_00742bb5:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                        ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar6 = iVar10 - (uVar9 & 0x1fffffff);
        if (((int)uVar6 < 0) || (iVar7 <= (int)uVar6)) {
LAB_00742bd4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        bVar4 = (byte)uVar6 & 0x1f;
        __s[uVar6 >> 5] = __s[uVar6 >> 5] & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar2->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Bit_t * Gia_ManFindComplLuts( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;  int i;
    // mark objects pointed by COs in negative polarity
    Vec_Bit_t * vMarks = Vec_BitStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 1 );
    // unmark objects pointed by COs in positive polarity
    Gia_ManForEachCo( pGia, pObj, i )
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) && !Gia_ObjFaninC0(pObj) )
            Vec_BitWriteEntry( vMarks, Gia_ObjFaninId0p(pGia, pObj), 0 );
    return vMarks;
}